

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_icy_carapace(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  OBJ_INDEX_DATA **ppOVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  OBJ_DATA *pOVar6;
  char *pcVar7;
  char *format;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar4 = is_affected(ch,(int)gsn_icy_carapace);
  if (bVar4) {
    pcVar7 = "You are already protected by an icy carapace.\n\r";
LAB_003196cb:
    send_to_char(pcVar7,ch);
    return;
  }
  sVar2 = ch->in_room->sector_type;
  bVar4 = false;
  if (sVar2 == 6) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar4 = false;
    if (sVar2 != 8) {
      pOVar6 = ch->in_room->contents;
      if (pOVar6 == (OBJ_DATA *)0x0) {
        bVar4 = false;
        bVar3 = false;
      }
      else {
        bVar3 = false;
        bVar4 = false;
        do {
          if (pOVar6->item_type == 0x19) {
            bVar3 = true;
          }
          ppOVar1 = &pOVar6->pIndexData;
          pOVar6 = pOVar6->next_content;
          if ((*ppOVar1)->vnum == 0xb78) {
            bVar4 = true;
          }
        } while (pOVar6 != (OBJ_DATA *)0x0);
      }
      if ((!bVar4) && (!bVar3)) {
        pcVar7 = "There is not enough water here to form an icy carapace.\n\r";
        goto LAB_003196cb;
      }
    }
  }
  pcVar7 = "A shell of water flows up around you and solidifies into an icy carapace.";
  if (bVar4) {
    pcVar7 = "Water flows up from the puddle on the ground, forming an icy carapace around you.";
  }
  pcVar5 = "A shell of water flows up around $n and solidifies into an icy carapace.";
  if (bVar4) {
    pcVar5 = "Water flows up from the puddle on the ground, solidifying as ice around $n.";
  }
  format = "Water flows up from $p, forming an icy carapace around you.";
  if (!bVar3) {
    format = pcVar7;
  }
  pcVar7 = "Water flows up from $p, solidifying as ice around $n.";
  if (!bVar3) {
    pcVar7 = pcVar5;
  }
  act(format,ch,(void *)0x0,(void *)0x0,3);
  act(pcVar7,ch,(void *)0x0,(void *)0x0,0);
  init_affect(&local_90);
  local_90.where = 0;
  local_90.aftype = 0;
  local_90.type = gsn_icy_carapace;
  local_90.duration = (short)(int)((float)level * 0.7);
  local_90.modifier = (short)(int)((float)level * 0.82);
  local_90.location = 0x11;
  local_90.owner = ch;
  local_90.level = (short)level;
  affect_to_char(ch,&local_90);
  local_90.location = 2;
  local_90.modifier = -3;
  affect_to_char(ch,&local_90);
  local_90.aftype = 5;
  local_90._34_4_ = local_90._34_4_ & 0xffff0000;
  local_90.where = 3;
  local_90.mod_name = 0xc;
  local_90.bitvector[0]._1_1_ = local_90.bitvector[0]._1_1_ | 1;
  affect_to_char(ch,&local_90);
  return;
}

Assistant:

void spell_icy_carapace(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = nullptr;
	AFFECT_DATA af;
	bool puddle = false, fountain = false;

	if (is_affected(ch, gsn_icy_carapace))
	{
		send_to_char("You are already protected by an icy carapace.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type != SECT_WATER && ch->in_room->sector_type != SECT_UNDERWATER)
	{
		for (obj = ch->in_room->contents; obj; obj = obj->next_content)
		{
			if (obj->item_type == ITEM_FOUNTAIN)
				fountain = true;

			if (obj->pIndexData->vnum == OBJ_VNUM_PUDDLE)
				puddle = true;
		}

		if (!puddle && !fountain)
		{
			send_to_char("There is not enough water here to form an icy carapace.\n\r", ch);
			return;
		}
	}

	if (fountain)
	{
		act("Water flows up from $p, forming an icy carapace around you.", ch, obj, 0, TO_CHAR);
		act("Water flows up from $p, solidifying as ice around $n.", ch, obj, 0, TO_ROOM);
	}
	else if (puddle)
	{
		act("Water flows up from the puddle on the ground, forming an icy carapace around you.", ch, 0, 0, TO_CHAR);
		act("Water flows up from the puddle on the ground, solidifying as ice around $n.", ch, 0, 0, TO_ROOM);

		if (obj)
			extract_obj(obj);
	}
	else
	{
		act("A shell of water flows up around you and solidifies into an icy carapace.", ch, 0, 0, TO_CHAR);
		act("A shell of water flows up around $n and solidifies into an icy carapace.", ch, 0, 0, TO_ROOM);
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_icy_carapace;
	af.location = APPLY_AC;
	af.level = level;
	af.duration = (int)((float)level * 0.7);
	af.modifier = (int)((float)level * 0.82);
	af.owner = ch;
	affect_to_char(ch, &af);

	af.location = APPLY_DEX;
	af.modifier = -3;
	affect_to_char(ch, &af);

	af.aftype = AFT_INVIS;
	af.location = 0;
	af.where = TO_RESIST;
	af.mod_name = MOD_RESISTANCE;
	SET_BIT(af.bitvector, RES_COLD);
	affect_to_char(ch, &af);
}